

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Type::Clear(Type *this)

{
  ulong uVar1;
  SourceContext *this_00;
  anon_union_112_1_493b367e_for_Type_3 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal LStack_18;
  
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Field>>
            (&(this->field_0)._impl_.fields_.super_RepeatedPtrFieldBase);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.oneofs_.super_RepeatedPtrFieldBase);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>>
            (&(this->field_0)._impl_.options_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [112])aVar2 & (undefined1  [112])0x7) == (undefined1  [112])0x0)
  goto LAB_00ebe1b6;
  if (((undefined1  [112])aVar2 & (undefined1  [112])0x1) != (undefined1  [112])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x50);
    if ((uVar1 & 3) != 0) {
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
      goto LAB_00ebe185;
    }
LAB_00ebe1db:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    line = 0x20b;
LAB_00ebe20f:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_18,file,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
  }
LAB_00ebe185:
  if (((undefined1  [112])aVar2 & (undefined1  [112])0x2) != (undefined1  [112])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x58);
    if ((uVar1 & 3) == 0) goto LAB_00ebe1db;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [112])aVar2 & (undefined1  [112])0x4) != (undefined1  [112])0x0) {
    this_00 = (this->field_0)._impl_.source_context_;
    if (this_00 == (SourceContext *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
      ;
      failure_msg = "_impl_.source_context_ != nullptr";
      line = 0x278;
      goto LAB_00ebe20f;
    }
    SourceContext::Clear(this_00);
  }
LAB_00ebe1b6:
  (this->field_0)._impl_.syntax_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Type::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Type)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.fields_.Clear();
  _impl_.oneofs_.Clear();
  _impl_.options_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.edition_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.source_context_ != nullptr);
      _impl_.source_context_->Clear();
    }
  }
  _impl_.syntax_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}